

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O0

void __thiscall xe::ContainerFormatParser::ContainerFormatParser(ContainerFormatParser *this)

{
  ContainerFormatParser *this_local;
  
  this->m_element = CONTAINERELEMENT_INCOMPLETE;
  this->m_elementLen = 0;
  this->m_state = STATE_AT_LINE_START;
  std::__cxx11::string::string((string *)&this->m_attribute);
  std::__cxx11::string::string((string *)&this->m_value);
  de::RingBuffer<unsigned_char>::RingBuffer(&this->m_buf,0x400);
  return;
}

Assistant:

ContainerFormatParser::ContainerFormatParser (void)
	: m_element		(CONTAINERELEMENT_INCOMPLETE)
	, m_elementLen	(0)
	, m_state		(STATE_AT_LINE_START)
	, m_buf			(CONTAINERFORMATPARSER_INITIAL_BUFFER_SIZE)
{
}